

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamStandardIndex::WriteHeader(BamStandardIndex *this)

{
  IBamIODevice *pIVar1;
  uint32_t val;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BamException *this_00;
  int32_t numReferences;
  uint local_6c;
  string local_68;
  string local_48;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,"BAI\x01",4);
  iVar3 = (int)((ulong)((long)(this->m_indexFileSummary).
                              super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_indexFileSummary).
                             super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_6c = iVar3 * -0x55555555;
  if (this->m_isBigEndian == true) {
    local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
               iVar3 * -0x55000000;
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_6c,4);
  if (CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 8) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"BamStandardIndex::WriteHeader","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"could not write BAI header","");
  BamException::BamException(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteHeader()
{

    int64_t numBytesWritten = 0;

    // write magic number
    numBytesWritten += m_resources.Device->Write(BamStandardIndex::BAI_MAGIC, 4);

    // write number of reference sequences
    int32_t numReferences = m_indexFileSummary.size();
    if (m_isBigEndian) {
        SwapEndian_32(numReferences);
    }
    numBytesWritten +=
        m_resources.Device->Write((const char*)&numReferences, sizeof(numReferences));

    if (numBytesWritten != sizeof(numReferences) + 4) {
        throw BamException("BamStandardIndex::WriteHeader", "could not write BAI header");
    }
}